

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_date.cpp
# Opt level: O3

date_t duckdb::FromDateCast<long>(long year,long month,long day)

{
  int32_t year_00;
  int32_t month_00;
  bool bVar1;
  ConversionException *this;
  undefined1 auVar2 [16];
  int result_1;
  date_t result;
  int32_t local_58;
  date_t local_54;
  string local_50;
  
  bVar1 = TryCast::Operation<long,int>(year,&local_58,false);
  year_00 = local_58;
  if (!bVar1) {
    auVar2 = __cxa_allocate_exception(0x10);
    CastExceptionText<long,int>(&local_50,(duckdb *)year,auVar2._8_8_);
    InvalidInputException::InvalidInputException(auVar2._0_8_,&local_50);
    __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = TryCast::Operation<long,int>(month,&local_58,false);
  month_00 = local_58;
  if (!bVar1) {
    auVar2 = __cxa_allocate_exception(0x10);
    CastExceptionText<long,int>(&local_50,(duckdb *)month,auVar2._8_8_);
    InvalidInputException::InvalidInputException(auVar2._0_8_,&local_50);
    __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = TryCast::Operation<long,int>(day,&local_58,false);
  if (!bVar1) {
    auVar2 = __cxa_allocate_exception(0x10);
    CastExceptionText<long,int>(&local_50,(duckdb *)day,auVar2._8_8_);
    InvalidInputException::InvalidInputException(auVar2._0_8_,&local_50);
    __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = Date::TryFromDate(year_00,month_00,local_58,&local_54);
  if (bVar1) {
    return (date_t)local_54.days;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Date out of range: %d-%d-%d","");
  ConversionException::ConversionException<long,long,long>(this,&local_50,year,month,day);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static date_t FromDateCast(T year, T month, T day) {
	date_t result;
	if (!Date::TryFromDate(Cast::Operation<T, int32_t>(year), Cast::Operation<T, int32_t>(month),
	                       Cast::Operation<T, int32_t>(day), result)) {
		throw ConversionException("Date out of range: %d-%d-%d", year, month, day);
	}
	return result;
}